

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall InterpTest_HostTrap_Test::TestBody(InterpTest_HostTrap_Test *this)

{
  Store *this_00;
  _func_int **pp_Var1;
  pointer pcVar2;
  Ref module;
  char *message;
  char *in_R9;
  internal local_288 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  undefined1 local_278 [40];
  AssertHelper local_250;
  Ptr local_248;
  Ptr local_228;
  RefPtr<wabt::interp::HostFunc> local_210;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_1f8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_1d8;
  AssertHelper local_1b8;
  FuncType local_1b0;
  _Any_data local_170;
  code *local_160;
  code *local_158;
  ModuleDesc local_150;
  
  local_278._0_8_ = operator_new(0x29);
  local_278._8_8_ = (long)&(((Module *)local_278._0_8_)->super_Object).finalizer_._M_invoker + 1;
  (((Module *)local_278._0_8_)->super_Object)._vptr_Object = (_func_int **)0x16d736100;
  *(undefined8 *)&(((Module *)local_278._0_8_)->super_Object).kind_ = 0xa02000060010401;
  *(undefined8 *)
   &(((Module *)local_278._0_8_)->super_Object).finalizer_.super__Function_base._M_functor =
       0x610174736f680401;
  *(undefined8 *)
   ((long)&(((Module *)local_278._0_8_)->super_Object).finalizer_.super__Function_base._M_functor +
   8) = 0x108000102030000;
  *(undefined8 *)
   ((long)&(((Module *)local_278._0_8_)->super_Object).finalizer_.super__Function_base._M_functor +
   9) = 0x101080001020300;
  *(undefined8 *)
   ((long)&(((Module *)local_278._0_8_)->super_Object).finalizer_.super__Function_base._M_manager +
   1) = 0xb0010000401060a;
  local_278._16_8_ = local_278._8_8_;
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
  if ((Module *)local_278._0_8_ != (Module *)0x0) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ - local_278._0_8_);
  }
  this_00 = &(this->super_InterpTest).store_;
  local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0.super_ExternType.kind = First;
  local_1b0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_1b0.params,&local_1d8);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_1b0.results,&local_1f8);
  local_170._8_8_ = 0;
  local_158 = std::
              _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc:392:21)>
              ::_M_invoke;
  local_160 = std::
              _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc:392:21)>
              ::_M_manager;
  local_170._M_unused._M_object = this;
  wabt::interp::Store::
  Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
            (&local_210,this_00,this_00,&local_1b0,
             (function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
              *)&local_170);
  if (local_160 != (code *)0x0) {
    (*local_160)(&local_170,&local_170,3);
  }
  local_1b0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
  if (local_1b0.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::vector
            (&local_150.func_types,&(this->super_InterpTest).module_desc_.func_types);
  std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::vector
            (&local_150.imports,&(this->super_InterpTest).module_desc_.imports);
  std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::vector
            (&local_150.funcs,&(this->super_InterpTest).module_desc_.funcs);
  std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::vector
            (&local_150.tables,&(this->super_InterpTest).module_desc_.tables);
  std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::vector
            (&local_150.memories,&(this->super_InterpTest).module_desc_.memories);
  std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::vector
            (&local_150.globals,&(this->super_InterpTest).module_desc_.globals);
  std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::vector
            (&local_150.tags,&(this->super_InterpTest).module_desc_.tags);
  std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::vector
            (&local_150.exports,&(this->super_InterpTest).module_desc_.exports);
  std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::vector
            (&local_150.starts,&(this->super_InterpTest).module_desc_.starts);
  std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::vector
            (&local_150.elems,&(this->super_InterpTest).module_desc_.elems);
  std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::vector
            (&local_150.datas,&(this->super_InterpTest).module_desc_.datas);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_150.istream.data_,&(this->super_InterpTest).module_desc_.istream.data_);
  wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
            ((RefPtr<wabt::interp::Module> *)local_278,this_00,this_00,&local_150);
  (this->super_InterpTest).mod_.obj_ = (Module *)local_278._0_8_;
  (this->super_InterpTest).mod_.store_ = (Store *)local_278._8_8_;
  (this->super_InterpTest).mod_.root_index_ = local_278._16_8_;
  local_278._16_8_ = (pointer)0x0;
  local_278._0_8_ = (Module *)0x0;
  local_278._8_8_ = (Store *)0x0;
  wabt::interp::ModuleDesc::~ModuleDesc(&local_150);
  local_228.root_index_ = 0;
  local_228.obj_ = (Trap *)0x0;
  local_228.store_ = (Store *)0x0;
  module = wabt::interp::RefPtr<wabt::interp::Module>::ref(&(this->super_InterpTest).mod_);
  pp_Var1 = (_func_int **)((local_210.obj_)->super_Func).super_Extern.super_Object.self_.index;
  local_278._0_8_ = operator_new(8);
  local_278._8_8_ = &(((Module *)local_278._0_8_)->super_Object).kind_;
  (((Module *)local_278._0_8_)->super_Object)._vptr_Object = pp_Var1;
  local_278._16_8_ = local_278._8_8_;
  wabt::interp::Instance::Instantiate(&local_248,this_00,module,(RefVec *)local_278,&local_228);
  if (local_248.obj_ != (Instance *)0x0) {
    wabt::interp::Store::DeleteRoot(local_248.store_,local_248.root_index_);
    local_248.obj_ = (Instance *)0x0;
    local_248.store_ = (Store *)0x0;
    local_248.root_index_ = 0;
  }
  if ((Module *)local_278._0_8_ != (Module *)0x0) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ - local_278._0_8_);
  }
  local_288[0] = (internal)(local_228.obj_ != (Trap *)0x0);
  local_280 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_228.obj_ == (Trap *)0x0) {
    testing::Message::Message((Message *)&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,local_288,(AssertionResult *)0x1f8286,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x192,(char *)local_278._0_8_);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((Module *)local_278._0_8_ != (Module *)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
    }
  }
  else {
    pcVar2 = ((local_228.obj_)->message_)._M_dataplus._M_p;
    local_278._0_8_ = (Module *)(local_278 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,pcVar2,pcVar2 + ((local_228.obj_)->message_)._M_string_length);
    testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
              (local_288,"\"boom\"","trap->message()",(char (*) [5])"boom",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
    if ((Module *)local_278._0_8_ != (Module *)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_278._16_8_ + 1));
    }
    if (local_288[0] != (internal)0x0) goto LAB_001411c4;
    testing::Message::Message((Message *)local_278);
    if (local_280 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_280->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x193,message);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    local_250.data_ = (AssertHelperData *)local_278._0_8_;
  }
  if ((Module *)local_250.data_ != (Module *)0x0) {
    (*(((Module *)local_250.data_)->super_Object)._vptr_Object[1])();
  }
LAB_001411c4:
  if (local_280 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_280,local_280);
  }
  if (local_228.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_228.store_,local_228.root_index_);
  }
  if (local_210.obj_ != (HostFunc *)0x0) {
    wabt::interp::Store::DeleteRoot(local_210.store_,local_210.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpTest, HostTrap) {
  // (import "host" "a" (func $0))
  // (func $1 call $0)
  // (start $1)
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x04, 0x01,
      0x60, 0x00, 0x00, 0x02, 0x0a, 0x01, 0x04, 0x68, 0x6f, 0x73, 0x74,
      0x01, 0x61, 0x00, 0x00, 0x03, 0x02, 0x01, 0x00, 0x08, 0x01, 0x01,
      0x0a, 0x06, 0x01, 0x04, 0x00, 0x10, 0x00, 0x0b,
  });

  auto host_func =
      HostFunc::New(store_, FuncType{{}, {}},
                    [&](Thread& thread, const Values& params, Values& results,
                        Trap::Ptr* out_trap) -> Result {
                      *out_trap = Trap::New(store_, "boom");
                      return Result::Error;
                    });

  mod_ = Module::New(store_, module_desc_);
  RefPtr<Trap> trap;
  Instance::Instantiate(store_, mod_.ref(), {host_func->self()}, &trap);

  ASSERT_TRUE(trap);
  ASSERT_EQ("boom", trap->message());
}